

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowOpacity(GLFWwindow *handle,float opacity)

{
  _GLFWwindow *in_RDI;
  float in_XMM0_Da;
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    _glfwInputError((int)(double)in_XMM0_Da,(char *)0x10004,"Invalid window opacity %f");
  }
  else {
    (*_glfw.platform.setWindowOpacity)(in_RDI,in_XMM0_Da);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowOpacity(GLFWwindow* handle, float opacity)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(opacity == opacity);
    assert(opacity >= 0.f);
    assert(opacity <= 1.f);

    _GLFW_REQUIRE_INIT();

    if (opacity != opacity || opacity < 0.f || opacity > 1.f)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid window opacity %f", opacity);
        return;
    }

    _glfw.platform.setWindowOpacity(window, opacity);
}